

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwizard.cpp
# Opt level: O0

void __thiscall QWizardHeader::QWizardHeader(QWizardHeader *this,QWidget *parent)

{
  QLayout *this_00;
  QFont *font_00;
  QWidget *widget;
  QFont *pQVar1;
  QWidget *widget_00;
  QWidget *in_RSI;
  undefined8 *in_RDI;
  long in_FS_OFFSET;
  QFont font;
  Policy in_stack_fffffffffffffee8;
  Policy in_stack_fffffffffffffeec;
  undefined1 on;
  enum_type in_stack_fffffffffffffef0;
  enum_type in_stack_fffffffffffffef4;
  QWidget *in_stack_ffffffffffffff00;
  QFlagsStorage<Qt::WindowType> in_stack_ffffffffffffff0c;
  QFlagsStorage<Qt::WindowType> f;
  QWidget *this_01;
  ulong uVar2;
  QGridLayout *this_02;
  QFlagsStorage<Qt::AlignmentFlag> alignment;
  QFlagsStorage<Qt::AlignmentFlag> in_stack_ffffffffffffffcc;
  undefined1 *local_18;
  undefined1 *puStack_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QFlags<Qt::WindowType>::QFlags((QFlags<Qt::WindowType> *)0x7b3981);
  QWidget::QWidget(in_stack_ffffffffffffff00,in_RSI,(WindowFlags)in_stack_ffffffffffffff0c.i);
  *in_RDI = &PTR_metaObject_00d26400;
  in_RDI[2] = &PTR__QWizardHeader_00d265b0;
  QPixmap::QPixmap((QPixmap *)(in_RDI + 9));
  QWidget::setSizePolicy
            ((QWidget *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
             in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
  f.i = 9;
  QWidget::setBackgroundRole
            ((QWidget *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
             in_stack_fffffffffffffeec);
  uVar2 = 0x28;
  this_00 = (QLayout *)operator_new(0x28);
  QFlags<Qt::WindowType>::QFlags((QFlags<Qt::WindowType> *)0x7b3a1a);
  QLabel::QLabel((QLabel *)this_00,in_RSI,(WindowFlags)f.i);
  in_RDI[5] = this_00;
  QWidget::setBackgroundRole
            ((QWidget *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
             in_stack_fffffffffffffeec);
  on = (undefined1)(in_stack_fffffffffffffeec >> 0x18);
  font_00 = (QFont *)operator_new(uVar2);
  QFlags<Qt::WindowType>::QFlags((QFlags<Qt::WindowType> *)0x7b3a78);
  QLabel::QLabel((QLabel *)this_00,in_RSI,(WindowFlags)f.i);
  in_RDI[6] = font_00;
  this_01 = (QWidget *)in_RDI[6];
  Qt::operator|(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0);
  QLabel::setAlignment
            ((QLabel *)this_00,
             (QFlagsStorageHelper<Qt::AlignmentFlag,_4>)SUB84((ulong)this_01 >> 0x20,0));
  QLabel::setWordWrap((QLabel *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                      (bool)on);
  widget = (QWidget *)operator_new(uVar2);
  QFlags<Qt::WindowType>::QFlags((QFlags<Qt::WindowType> *)0x7b3b18);
  QLabel::QLabel((QLabel *)this_00,in_RSI,(WindowFlags)f.i);
  in_RDI[7] = widget;
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_10 = &DAT_aaaaaaaaaaaaaaaa;
  pQVar1 = QWidget::font((QWidget *)in_RDI[5]);
  QFont::QFont((QFont *)&local_18,pQVar1);
  QFont::setBold((QFont *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),(bool)on);
  QWidget::setFont(this_01,font_00);
  widget_00 = (QWidget *)operator_new(0x20);
  QGridLayout::QGridLayout((QGridLayout *)this_00,in_RSI);
  in_RDI[8] = widget_00;
  this_02 = (QGridLayout *)in_RDI[8];
  QMargins::QMargins((QMargins *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
  QLayout::setContentsMargins(this_00,(QMargins *)in_RSI);
  (**(code **)(*(long *)in_RDI[8] + 0x68))((long *)in_RDI[8],0);
  QGridLayout::setRowMinimumHeight((QGridLayout *)this_00,(int)((ulong)in_RSI >> 0x20),(int)in_RSI);
  QGridLayout::setRowStretch((QGridLayout *)this_00,(int)((ulong)in_RSI >> 0x20),(int)in_RSI);
  QGridLayout::setColumnStretch((QGridLayout *)this_00,(int)((ulong)in_RSI >> 0x20),(int)in_RSI);
  QGridLayout::setColumnMinimumWidth
            ((QGridLayout *)this_00,(int)((ulong)in_RSI >> 0x20),(int)in_RSI);
  QGridLayout::setColumnMinimumWidth
            ((QGridLayout *)this_00,(int)((ulong)in_RSI >> 0x20),(int)in_RSI);
  QFlags<Qt::AlignmentFlag>::QFlags((QFlags<Qt::AlignmentFlag> *)0x7b3ce8);
  QGridLayout::addWidget
            ((QGridLayout *)widget_00,widget,(int)(uVar2 >> 0x20),(int)uVar2,
             (int)((ulong)this_01 >> 0x20),(int)this_01,
             (QFlagsStorageHelper<Qt::AlignmentFlag,_4>)SUB84((ulong)this_02 >> 0x20,0));
  QFlags<Qt::AlignmentFlag>::QFlags((QFlags<Qt::AlignmentFlag> *)0x7b3d4e);
  QGridLayout::addWidget
            (this_02,widget_00,(int)((ulong)widget >> 0x20),(int)widget,
             (Alignment)in_stack_ffffffffffffffcc.i);
  alignment.i = (Int)((ulong)this_02 >> 0x20);
  QFlags<Qt::AlignmentFlag>::QFlags((QFlags<Qt::AlignmentFlag> *)0x7b3dae);
  QGridLayout::addWidget
            ((QGridLayout *)widget_00,widget,(int)(uVar2 >> 0x20),(int)uVar2,
             (int)((ulong)this_01 >> 0x20),(int)this_01,(Alignment)alignment.i);
  QFont::~QFont((QFont *)&local_18);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QWizardHeader::QWizardHeader(QWidget *parent)
    : QWidget(parent)
{
    setSizePolicy(QSizePolicy::Expanding, QSizePolicy::Fixed);
    setBackgroundRole(QPalette::Base);

    titleLabel = new QLabel(this);
    titleLabel->setBackgroundRole(QPalette::Base);

    subTitleLabel = new QLabel(this);
    subTitleLabel->setAlignment(Qt::AlignTop | Qt::AlignLeft);
    subTitleLabel->setWordWrap(true);

    logoLabel = new QLabel(this);

    QFont font = titleLabel->font();
    font.setBold(true);
    titleLabel->setFont(font);

    layout = new QGridLayout(this);
    layout->setContentsMargins(QMargins());
    layout->setSpacing(0);

    layout->setRowMinimumHeight(3, 1);
    layout->setRowStretch(4, 1);

    layout->setColumnStretch(2, 1);
    layout->setColumnMinimumWidth(4, 2 * GapBetweenLogoAndRightEdge);
    layout->setColumnMinimumWidth(6, GapBetweenLogoAndRightEdge);

    layout->addWidget(titleLabel, 2, 1, 1, 2);
    layout->addWidget(subTitleLabel, 4, 2);
    layout->addWidget(logoLabel, 1, 5, 5, 1);
}